

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O3

void __thiscall cppcms::impl::cgi::scgi::do_eof(scgi *this)

{
  error_code e;
  undefined4 local_20 [2];
  undefined8 local_18;
  
  if (this->eof_callback_ == true) {
    booster::aio::basic_io_device::cancel();
  }
  this->eof_callback_ = false;
  local_20[0] = 0;
  local_18 = std::_V2::system_category();
  booster::aio::stream_socket::shutdown(&this->socket_,1,local_20);
  booster::aio::basic_io_device::close((error_code *)&this->socket_);
  return;
}

Assistant:

virtual void do_eof()
		{
			if(eof_callback_)
				socket_.cancel();
			eof_callback_ = false;
			booster::system::error_code e;
			socket_.shutdown(io::stream_socket::shut_wr,e);
			socket_.close(e);
		}